

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O0

void __thiscall unit_test::unit_test(unit_test *this,service *s)

{
  io_service *piVar1;
  service *in_RSI;
  application *in_RDI;
  unit_test *in_stack_fffffffffffffed0;
  member_type in_stack_fffffffffffffed8;
  string local_120 [8];
  string *in_stack_fffffffffffffee8;
  url_dispatcher *in_stack_fffffffffffffef0;
  allocator local_e9;
  string local_e8 [32];
  code *local_c8;
  undefined8 local_c0;
  allocator local_b1;
  string local_b0 [32];
  code *local_90;
  undefined8 local_88;
  allocator local_79;
  string local_78 [32];
  code *local_58;
  undefined8 local_50;
  allocator local_41;
  string local_40 [64];
  
  cppcms::application::application(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__unit_test_00112a70;
  piVar1 = (io_service *)cppcms::service::get_io_service();
  booster::aio::deadline_timer::deadline_timer((deadline_timer *)(in_RDI + 0x28),piVar1);
  std::shared_ptr<cppcms::http::context>::shared_ptr((shared_ptr<cppcms::http::context> *)0x10b141);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"/normal",&local_41);
  local_58 = normal;
  local_50 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"/throws",&local_79);
  local_90 = throws;
  local_88 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"/delayed",&local_b1);
  local_c8 = delayed;
  local_c0 = 0;
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"/delayed_with_response",&local_e9);
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8,
             in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cppcms::application::dispatcher();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"/delayed_twice",(allocator *)&stack0xfffffffffffffedf);
  cppcms::url_dispatcher::assign<unit_test>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffed8,
             (unit_test *)0x0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  return;
}

Assistant:

unit_test(cppcms::service &s) : 
		cppcms::application(s),
		timer_(s.get_io_service())
	{
		dispatcher().assign("/normal",&unit_test::normal,this);
		dispatcher().assign("/throws",&unit_test::throws,this);
		dispatcher().assign("/delayed",&unit_test::delayed,this);
		dispatcher().assign("/delayed_with_response",&unit_test::delayed_with_response,this);
		dispatcher().assign("/delayed_twice",&unit_test::delayed_twice,this);
	}